

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O3

int mbedtls_aes_crypt_ecb(mbedtls_aes_context *ctx,int mode,uchar *input,uchar *output)

{
  int iVar1;
  
  iVar1 = -0x21;
  if ((uint)mode < 2) {
    if (mode == 0) {
      mbedtls_internal_aes_decrypt(ctx,input,output);
    }
    else {
      mbedtls_internal_aes_encrypt(ctx,input,output);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mbedtls_aes_crypt_ecb(mbedtls_aes_context *ctx,
                          int mode,
                          const unsigned char input[16],
                          unsigned char output[16])
{
    if (mode != MBEDTLS_AES_ENCRYPT && mode != MBEDTLS_AES_DECRYPT) {
        return MBEDTLS_ERR_AES_BAD_INPUT_DATA;
    }

#if defined(MAY_NEED_TO_ALIGN)
    aes_maybe_realign(ctx);
#endif

#if defined(MBEDTLS_AESNI_HAVE_CODE)
    if (mbedtls_aesni_has_support(MBEDTLS_AESNI_AES)) {
        return mbedtls_aesni_crypt_ecb(ctx, mode, input, output);
    }
#endif

#if defined(MBEDTLS_AESCE_HAVE_CODE)
    if (MBEDTLS_AESCE_HAS_SUPPORT()) {
        return mbedtls_aesce_crypt_ecb(ctx, mode, input, output);
    }
#endif

#if defined(MBEDTLS_VIA_PADLOCK_HAVE_CODE)
    if (aes_padlock_ace > 0) {
        return mbedtls_padlock_xcryptecb(ctx, mode, input, output);
    }
#endif

#if !defined(MBEDTLS_AES_USE_HARDWARE_ONLY)
#if !defined(MBEDTLS_BLOCK_CIPHER_NO_DECRYPT)
    if (mode == MBEDTLS_AES_DECRYPT) {
        return mbedtls_internal_aes_decrypt(ctx, input, output);
    } else
#endif
    {
        return mbedtls_internal_aes_encrypt(ctx, input, output);
    }
#endif /* !MBEDTLS_AES_USE_HARDWARE_ONLY */
}